

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char *target;
  char **ppcStack_30;
  int tok;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  ppcStack_30 = nextTokPtr;
  nextTokPtr_local = (char **)end;
  end_local = ptr;
  ptr_local = (char *)enc;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar1 = (*enc[3].nameLength)(enc,ptr);
    if ((iVar1 != 0) || (iVar1 = (**(code **)(ptr_local + 0x198))(ptr_local,end_local), iVar1 == 0))
    {
      *ppcStack_30 = end_local;
      return 0;
    }
    end_local = end_local + 2;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar2 = (*enc[3].skipS)(enc,ptr);
    if (((int)pcVar2 != 0) ||
       (iVar1 = (**(code **)(ptr_local + 0x1a0))(ptr_local,end_local), iVar1 == 0)) {
      *ppcStack_30 = end_local;
      return 0;
    }
    end_local = end_local + 3;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar1 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)ptr);
    if ((iVar1 != 0) || (iVar1 = (**(code **)(ptr_local + 0x1a8))(ptr_local,end_local), iVar1 == 0))
    {
      *ppcStack_30 = end_local;
      return 0;
    }
    end_local = end_local + 4;
    break;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    if ((long)nextTokPtr_local - (long)end_local < 1) {
      return -1;
    }
    pcVar2 = end_local;
    switch(ptr_local[(ulong)(byte)*end_local + 0x80]) {
    case '\x05':
      if ((long)nextTokPtr_local - (long)end_local < 2) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 0x1b0))(ptr_local,end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (**(code **)(ptr_local + 0x180))(ptr_local,end_local), iVar1 == 0)) {
        *ppcStack_30 = end_local;
        return 0;
      }
      end_local = end_local + 2;
      break;
    case '\x06':
      if ((long)nextTokPtr_local - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 0x1b8))(ptr_local,end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (**(code **)(ptr_local + 0x188))(ptr_local,end_local), iVar1 == 0)) {
        *ppcStack_30 = end_local;
        return 0;
      }
      end_local = end_local + 3;
      break;
    case '\a':
      if ((long)nextTokPtr_local - (long)end_local < 4) {
        return -2;
      }
      iVar1 = (**(code **)(ptr_local + 0x1c0))(ptr_local,end_local);
      if ((iVar1 != 0) || (iVar1 = (**(code **)(ptr_local + 400))(ptr_local,end_local), iVar1 == 0))
      {
        *ppcStack_30 = end_local;
        return 0;
      }
      end_local = end_local + 4;
      break;
    case '\t':
    case '\n':
    case '\x15':
      iVar1 = normal_checkPiTarget((ENCODING *)ptr_local,ptr,end_local,(int *)((long)&target + 4));
      if (iVar1 == 0) {
        *ppcStack_30 = end_local;
        return 0;
      }
      pcVar2 = end_local + 1;
      do {
        end_local = pcVar2;
        if ((long)nextTokPtr_local - (long)end_local < 1) {
          return -1;
        }
        switch(ptr_local[(ulong)(byte)*end_local + 0x80]) {
        case '\0':
        case '\x01':
        case '\b':
          *ppcStack_30 = end_local;
          return 0;
        default:
          pcVar2 = end_local + 1;
          break;
        case '\x05':
          if ((long)nextTokPtr_local - (long)end_local < 2) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1b0))(ptr_local,end_local);
          if (iVar1 != 0) {
            *ppcStack_30 = end_local;
            return 0;
          }
          pcVar2 = end_local + 2;
          break;
        case '\x06':
          if ((long)nextTokPtr_local - (long)end_local < 3) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1b8))(ptr_local,end_local);
          if (iVar1 != 0) {
            *ppcStack_30 = end_local;
            return 0;
          }
          pcVar2 = end_local + 3;
          break;
        case '\a':
          if ((long)nextTokPtr_local - (long)end_local < 4) {
            return -2;
          }
          iVar1 = (**(code **)(ptr_local + 0x1c0))(ptr_local,end_local);
          if (iVar1 != 0) {
            *ppcStack_30 = end_local;
            return 0;
          }
          pcVar2 = end_local + 4;
          break;
        case '\x0f':
          pcVar2 = end_local + 1;
          if ((long)nextTokPtr_local - (long)pcVar2 < 1) {
            return -1;
          }
          if (*pcVar2 == '>') {
            *ppcStack_30 = end_local + 2;
            return target._4_4_;
          }
        }
      } while( true );
    case '\x0f':
      iVar1 = normal_checkPiTarget((ENCODING *)ptr_local,ptr,end_local,(int *)((long)&target + 4));
      if (iVar1 == 0) {
        *ppcStack_30 = end_local;
        return 0;
      }
      pcVar2 = end_local + 1;
      if ((long)nextTokPtr_local - (long)pcVar2 < 1) {
        return -1;
      }
      if (*pcVar2 == '>') {
        *ppcStack_30 = end_local + 2;
        return target._4_4_;
      }
    default:
      end_local = pcVar2;
      *ppcStack_30 = end_local;
      return 0;
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      end_local = end_local + 1;
      break;
    case '\x1d':
      *ppcStack_30 = end_local;
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr) {
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
          INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (! PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}